

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O3

void __thiscall xLearn::Trainer::SaveTxtModel(Trainer *this,string *filename)

{
  int iVar1;
  ostream *poVar2;
  Logger local_64;
  string local_60;
  string local_40;
  
  if (filename->_M_string_length == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_64.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,"");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"SaveTxtModel","");
    poVar2 = Logger::Start(ERR,&local_40,0x56,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x56);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"filename.empty()",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\n");
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)filename);
    if (iVar1 != 0) {
      Model::SerializeToTXT(this->model_,filename);
      return;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_64.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,"");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"SaveTxtModel","");
    poVar2 = Logger::Start(ERR,&local_40,0x57,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/trainer.h"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"filename.compare(\"none\")",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    iVar1 = std::__cxx11::string::compare((char *)filename);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  Logger::~Logger(&local_64);
  abort();
}

Assistant:

void SaveTxtModel(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_NE(filename.compare("none"), 0);
    model_->SerializeToTXT(filename);
  }